

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::RandSeqProductionSymbol::RandSeqProductionSymbol
          (RandSeqProductionSymbol *this,Compilation *compilation,string_view name,
          SourceLocation loc)

{
  string_view name_00;
  char *in_RCX;
  size_t in_RDX;
  Symbol *in_RDI;
  SourceLocation in_R8;
  Compilation *in_stack_ffffffffffffffb8;
  bitmask<slang::ast::DeclaredTypeFlags> flags;
  
  name_00._M_str = in_RCX;
  name_00._M_len = in_RDX;
  Symbol::Symbol(in_RDI,RandSeqProduction,name_00,in_R8);
  Scope::Scope((Scope *)in_R8,in_stack_ffffffffffffffb8,in_RDI);
  flags.m_bits = in_R8._4_4_;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask
            ((bitmask<slang::ast::DeclaredTypeFlags> *)&stack0xffffffffffffffbc,None);
  DeclaredType::DeclaredType((DeclaredType *)in_stack_ffffffffffffffb8,in_RDI,flags);
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)0x3ec120
            );
  std::optional<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
  ::optional((optional<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
              *)0x3ec131);
  return;
}

Assistant:

RandSeqProductionSymbol::RandSeqProductionSymbol(Compilation& compilation, std::string_view name,
                                                 SourceLocation loc) :
    Symbol(SymbolKind::RandSeqProduction, name, loc), Scope(compilation, this),
    declaredReturnType(*this) {
}